

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_cconvert.c
# Opt level: O0

int sp_cconvert(int m,int n,singlecomplex *A,int lda,int kl,int ku,singlecomplex *a,int_t *asub,
               int_t *xa,int_t *nnz)

{
  int iVar1;
  int iVar2;
  int local_50;
  int local_4c;
  singlecomplex *val;
  int_t *row;
  int_t ihigh;
  int_t ilow;
  int_t j;
  int_t i;
  int_t lasta;
  int ku_local;
  int kl_local;
  int lda_local;
  singlecomplex *A_local;
  int n_local;
  int m_local;
  
  j = 0;
  for (ihigh = 0; ihigh < n; ihigh = ihigh + 1) {
    xa[ihigh] = j;
    iVar1 = xa[ihigh];
    iVar2 = xa[ihigh];
    if (ihigh - ku < 0) {
      local_4c = 0;
    }
    else {
      local_4c = ihigh - ku;
    }
    if (n + -1 < ihigh + kl) {
      local_50 = n + -1;
    }
    else {
      local_50 = ihigh + kl;
    }
    for (ilow = local_4c; ilow <= local_50; ilow = ilow + 1) {
      a[(long)iVar1 + (long)(ilow - local_4c)] = A[ilow + ihigh * lda];
      asub[(long)iVar2 + (long)(ilow - local_4c)] = ilow;
    }
    j = (local_50 - local_4c) + 1 + j;
  }
  *nnz = j;
  xa[n] = j;
  return 0;
}

Assistant:

int
sp_cconvert(int m, int n, singlecomplex *A, int lda, int kl, int ku,
	   singlecomplex *a, int_t *asub, int_t *xa, int_t *nnz)
{
    int_t     lasta = 0;
    int_t     i, j, ilow, ihigh;
    int_t     *row;
    singlecomplex  *val;

    for (j = 0; j < n; ++j) {
	xa[j] = lasta;
	val = &a[xa[j]];
	row = &asub[xa[j]];

	ilow = SUPERLU_MAX(0, j - ku);
	ihigh = SUPERLU_MIN(n-1, j + kl);
	for (i = ilow; i <= ihigh; ++i) {
	    val[i-ilow] = A[i + j*lda];
	    row[i-ilow] = i;
	}
	lasta += ihigh - ilow + 1;
    }

    xa[n] = *nnz = lasta;
    return 0;
}